

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_checkExpectationsClearsTheExpectations_Test::testBody
          (TEST_MockCallTest_checkExpectationsClearsTheExpectations_Test *this)

{
  int iVar1;
  UtestShell *pUVar2;
  MockSupport *pMVar3;
  TestTerminator *pTVar4;
  SimpleString local_f0;
  SimpleString local_e0;
  SimpleString local_d0;
  SimpleString local_c0;
  undefined1 local_b0 [8];
  MockExpectedCallsDidntHappenFailure expectedFailure;
  undefined1 local_28 [8];
  MockExpectedCallsListForTest expectations;
  MockFailureReporterInstaller failureReporterInstaller;
  TEST_MockCallTest_checkExpectationsClearsTheExpectations_Test *this_local;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)
             ((long)&expectations.super_MockExpectedCallsList.head_ + 7));
  MockExpectedCallsListForTest::MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_28);
  SimpleString::SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_,"foobar");
  MockExpectedCallsListForTest::addFunction
            ((MockExpectedCallsListForTest *)local_28,
             (SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  SimpleString::~SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  pUVar2 = mockFailureTest();
  MockExpectedCallsDidntHappenFailure::MockExpectedCallsDidntHappenFailure
            ((MockExpectedCallsDidntHappenFailure *)local_b0,pUVar2,
             (MockExpectedCallsList *)local_28);
  SimpleString::SimpleString(&local_c0,"");
  pMVar3 = mock(&local_c0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_d0,"foobar");
  (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_d0);
  SimpleString::~SimpleString(&local_d0);
  SimpleString::~SimpleString(&local_c0);
  SimpleString::SimpleString(&local_e0,"");
  pMVar3 = mock(&local_e0,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_e0);
  pUVar2 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_f0,"");
  pMVar3 = mock(&local_f0,(MockFailureReporter *)0x0);
  iVar1 = (*pMVar3->_vptr_MockSupport[0x26])();
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)((byte)((byte)iVar1 ^ 1) & 1),"CHECK","! mock().expectedCallsLeft()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0x61,pTVar4);
  SimpleString::~SimpleString(&local_f0);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)local_b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0x62);
  MockExpectedCallsDidntHappenFailure::~MockExpectedCallsDidntHappenFailure
            ((MockExpectedCallsDidntHappenFailure *)local_b0);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_28);
  MockFailureReporterInstaller::~MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)
             ((long)&expectations.super_MockExpectedCallsList.head_ + 7));
  return;
}

Assistant:

TEST(MockCallTest, checkExpectationsClearsTheExpectations)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foobar");
    MockExpectedCallsDidntHappenFailure expectedFailure(mockFailureTest(), expectations);

    mock().expectOneCall("foobar");
    mock().checkExpectations();

    CHECK(! mock().expectedCallsLeft());
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}